

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeprovider.cpp
# Opt level: O0

bool anon_unknown.dwarf_15f65f::extractElementType(string *typePart,string *elementPart)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  reference pcVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_60;
  char c;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  int bracketCount;
  bool foundStart;
  bool foundArrayElement;
  string buffer;
  string *elementPart_local;
  string *typePart_local;
  
  std::__cxx11::string::string((string *)&bracketCount);
  bVar2 = false;
  __range1._0_4_ = 0;
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_60._M_current = (char *)std::__cxx11::string::end();
  while (bVar3 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffa0), bVar4 = false, bVar3) {
    pcVar5 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    cVar1 = *pcVar5;
    if (cVar1 == '[') {
      __range1._0_4_ = (int)__range1 + 1;
    }
    if ((cVar1 == ']') && (__range1._0_4_ = (int)__range1 + -1, bVar4 = bVar2, (int)__range1 == 0))
    break;
    std::__cxx11::string::operator+=((string *)&bracketCount,cVar1);
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &bracketCount,"Array[");
    if ((bVar4) && (!bVar2)) {
      bVar2 = true;
      std::__cxx11::string::clear();
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  if (bVar4) {
    std::__cxx11::string::operator=((string *)elementPart,(string *)&bracketCount);
  }
  std::__cxx11::string::~string((string *)&bracketCount);
  return bVar4;
}

Assistant:

bool extractElementType(std::string typePart, std::string& elementPart) {
		std::string buffer;
		bool foundArrayElement = false;
		bool foundStart = false;
		int bracketCount = 0;

		for (char c : typePart) {
			if (c == '[') {
				bracketCount++;
			}

			if (c == ']') {
				bracketCount--;
			}

			if (c == ']' && bracketCount == 0) {
				if (foundStart) {
					foundArrayElement = true;
				}

				break;
			}

			buffer += c;

			if (buffer == "Array[" && !foundStart) {
				foundStart = true;
				buffer.clear();
			}
		}

		if (foundArrayElement) {
			elementPart = buffer;
			return  true;
		} else {
			return false;
		}
	}